

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::
format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
::get_arg(format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
          *this,int id)

{
  anon_union_16_15_055d57a1_for_value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_1
  *this_00;
  format_arg arg;
  anon_union_16_15_055d57a1_for_value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_1
  local_38;
  type local_28;
  
  this_00 = &local_38;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  ::do_get((format_arg *)&local_38.string,&(this->context).args_,id);
  if (local_28 == named_arg_type) {
    local_38.string.size = *(size_t *)(local_38.long_long_value + 0x18);
    local_28 = *(type *)(local_38.long_long_value + 0x20);
    local_38.long_long_value = *(longlong *)(local_38.long_long_value + 0x10);
  }
  if (local_28 != none_type) {
    (this->arg).type_ = local_28;
    (this->arg).value_.field_0.long_long_value = local_38.long_long_value;
    (this->arg).value_.field_0.string.size = local_38.string.size;
    return;
  }
  internal::error_handler::on_error((error_handler *)&this_00->string,"argument index out of range")
  ;
}

Assistant:

void get_arg(int id) { arg = internal::get_arg(context, id); }